

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_list.cpp
# Opt level: O3

double __thiscall ExprEval::Engine::NodeList::calc(NodeList *this,size_t index,size_t direction)

{
  pointer pNVar1;
  pointer pNVar2;
  long lVar3;
  double dVar4;
  int iVar5;
  CustomOperator *pCVar6;
  CustomOperator *pCVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Exception *pEVar8;
  ulong uVar9;
  size_t sVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_vec;
  vector<int,_std::allocator<int>_> positions;
  Node node;
  ostringstream tmp;
  double args [10];
  double local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  void *local_330 [3];
  NodeType local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  string local_308;
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  undefined1 *local_2a0 [2];
  undefined1 local_290 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200 [3];
  ios_base local_190 [264];
  double local_88 [11];
  
  pNVar2 = (this->m_nodes).
           super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar9 = ((long)(this->m_nodes).
                 super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2 >> 4) *
          -0x3333333333333333;
  if (uVar9 < index || uVar9 - index == 0) {
    pEVar8 = (Exception *)__cxa_allocate_exception(0x30);
    std::__cxx11::to_string(local_200,index);
    std::operator+(&local_220,"node @ ",local_200);
    Exception::Exception(pEVar8,Expr_Logic,&local_220);
    __cxa_throw(pEVar8,&Exception::typeinfo,Exception::~Exception);
  }
  pNVar1 = pNVar2 + index;
  local_318 = pNVar1->type;
  uStack_314 = *(undefined4 *)&pNVar1->field_0x4;
  uStack_310 = *(undefined4 *)&pNVar1->number;
  uStack_30c = *(undefined4 *)((long)&pNVar1->number + 4);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  lVar3 = *(long *)&pNVar2[index].symbol._M_dataplus;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_308,lVar3,pNVar2[index].symbol._M_string_length + lVar3);
  local_2e8[0] = local_2d8;
  lVar3 = *(long *)&pNVar2[index].expression._M_dataplus;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2e8,lVar3,pNVar2[index].expression._M_string_length + lVar3);
  if (local_318 == Operator) {
    pCVar6 = (CustomOperator *)Operator::get_specification(&local_308);
    pCVar7 = pCVar6;
    if ((pCVar6 == (CustomOperator *)0x0) &&
       (pCVar7 = Operator::get_custom_specification(&local_308), pCVar7 == (CustomOperator *)0x0)) {
      pEVar8 = (Exception *)__cxa_allocate_exception(0x30);
      std::__cxx11::to_string(local_200,index);
      std::operator+(&local_240,"node @ ",local_200);
      Exception::Exception(pEVar8,Symbol_Not_Found,&local_240);
      __cxa_throw(pEVar8,&Exception::typeinfo,Exception::~Exception);
    }
    (*(pCVar7->super_BaseSpecification)._vptr_BaseSpecification[4])(local_330,pCVar7);
    for (uVar9 = 0; iVar5 = (*(pCVar7->super_BaseSpecification)._vptr_BaseSpecification[3])(pCVar7),
        uVar9 < CONCAT44(extraout_var,iVar5); uVar9 = uVar9 + 1) {
      iVar5 = *(int *)((long)local_330[0] + uVar9 * 4);
      if ((long)iVar5 < 0) {
        if (direction == 1) {
          pEVar8 = (Exception *)__cxa_allocate_exception(0x30);
          std::__cxx11::to_string(local_200,index);
          std::operator+(&local_260,"node @ ",local_200);
          Exception::Exception(pEVar8,Expr_Logic,&local_260);
          __cxa_throw(pEVar8,&Exception::typeinfo,Exception::~Exception);
        }
        uVar11 = 0;
        uVar12 = 0;
        if ((uint)-iVar5 <= index) {
          this->m_beg = this->m_beg - 1;
          sVar10 = 0xffffffffffffffff;
          goto LAB_001105ec;
        }
LAB_001105f7:
        local_88[uVar9] = (double)CONCAT44(uVar12,uVar11);
      }
      else if (iVar5 != 0) {
        if (direction == 0xffffffffffffffff) {
          pEVar8 = (Exception *)__cxa_allocate_exception(0x30);
          std::__cxx11::to_string(local_200,index);
          std::operator+(&local_280,"node @ ",local_200);
          Exception::Exception(pEVar8,Expr_Logic,&local_280);
          __cxa_throw(pEVar8,&Exception::typeinfo,Exception::~Exception);
        }
        this->m_end = this->m_end + 1;
        sVar10 = 1;
LAB_001105ec:
        dVar4 = calc(this,(long)iVar5 + index,sVar10);
        uVar11 = SUB84(dVar4,0);
        uVar12 = (undefined4)((ulong)dVar4 >> 0x20);
        goto LAB_001105f7;
      }
    }
    if (pCVar6 == (CustomOperator *)0x0) {
      local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar9 = 0;
          iVar5 = (*(pCVar7->super_BaseSpecification)._vptr_BaseSpecification[3])(pCVar7),
          uVar9 < CONCAT44(extraout_var_00,iVar5); uVar9 = uVar9 + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
        std::ostream::_M_insert<double>(local_88[uVar9]);
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_348,
                   &local_2c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
          operator_delete(local_2c0._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
        std::ios_base::~ios_base(local_190);
      }
      (*(pCVar7->super_BaseSpecification)._vptr_BaseSpecification[5])(local_2a0,pCVar7,&local_348);
      (this->m_cache).type = Expression;
      std::__cxx11::string::_M_assign((string *)&(this->m_cache).expression);
      if (local_2a0[0] != local_290) {
        operator_delete(local_2a0[0]);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_348);
      local_350 = 0.0;
    }
    else {
      sVar10 = Operator::get_index(&local_308);
      local_350 = Operator::trigger(sVar10,local_88);
      (this->m_cache).type = Empty;
    }
    if (local_330[0] != (void *)0x0) {
      operator_delete(local_330[0]);
    }
  }
  else {
    local_350 = 0.0;
    if (local_318 == Number) {
      local_350 = (double)CONCAT44(uStack_30c,uStack_310);
    }
  }
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  return local_350;
}

Assistant:

double NodeList::calc(size_t index, size_t direction){
            if(index >= m_nodes.size()){
                throw Exception(Error::Expr_Logic, "node @ " + std::to_string(index));
            }

            Node node = m_nodes[index];
            bool is_standard_opr = true;

            if(node.type == NodeType::Number){
                return node.number;
            } else if(node.type == NodeType::Operator){
                // std::cout<<"node symbol: "<<node.symbol<<'\n';
                double result = 0.0;
                Operator::BaseSpecification* specification = Operator::get_specification(node.symbol);
                if(!specification){
                    is_standard_opr = false;
                    // printf("standard opr\n");
                    if(!(specification = Operator::get_custom_specification(node.symbol))){
                        // printf("throwing...\n");
                        throw Exception(Error::Symbol_Not_Found, "node @ " + std::to_string(index));
                    }
                }

                auto positions = specification->get_arg_positons();
                double args[10];
                // std::cout<<"index: "<<index<<", list size: "<<size()<<'\n';
                for(size_t i=0; i<specification->get_n_arg(); ++i){
                    if(positions[i] < 0){
                        if(direction == 1){
                            throw Exception(Error::Expr_Logic, "node @ " + std::to_string(index));
                        }

                        if(index >= -positions[i]){
                            m_beg -= 1;
                            args[i] = calc(index+positions[i], -1);
                        } else{
                            args[i] = 0;
                        }
                    } else if(positions[i] > 0){
                        if(direction == -1)
                            throw Exception(Error::Expr_Logic, "node @ " + std::to_string(index));
                        
                        m_end += 1;
                        args[i] = calc(index+positions[i], 1);
                    }
                    // printf("> arg: %lf\n", args[i]);
                }

                if(is_standard_opr){
                    // printf("going with the standart opr...\n");
                    result = Operator::trigger(Operator::get_index(node.symbol), args);
                    m_cache.type = NodeType::Empty;
                } else{
                    std::vector<std::string> args_vec;
                    for(size_t i=0; i<specification->get_n_arg(); ++i){
                        std::ostringstream tmp;
                        tmp<<args[i];
                        args_vec.push_back(tmp.str());
                    }
                    m_cache.set(specification->convert(args_vec));
                    // std::cout<<"cache: "<<m_cache.expression<<'\n';
                }

                return result;
            } else{
                // TO DO
                return 0;
            }
        }